

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

size_t ggml_get_max_tensor_size(ggml_context *ctx)

{
  ggml_tensor *tensor;
  size_t sVar1;
  ulong uVar2;
  
  tensor = ggml_get_first_tensor(ctx);
  uVar2 = 0;
  for (; tensor != (ggml_tensor *)0x0; tensor = ggml_get_next_tensor(ctx,tensor)) {
    sVar1 = ggml_nbytes(tensor);
    if (uVar2 <= sVar1) {
      uVar2 = sVar1;
    }
  }
  return uVar2;
}

Assistant:

size_t ggml_get_max_tensor_size(const struct ggml_context * ctx) {
    size_t max_size = 0;

    for (struct ggml_tensor * tensor = ggml_get_first_tensor(ctx); tensor != NULL; tensor = ggml_get_next_tensor(ctx, tensor)) {
        size_t bytes = ggml_nbytes(tensor);
        max_size = MAX(max_size, bytes);
    }

    return max_size;
}